

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  LogFinisher local_81;
  string local_80;
  LogMessage local_60;
  undefined2 local_28;
  byte local_26;
  ulong value;
  
  iVar1 = (*this->_vptr_MessageLite[0xb])();
  value = CONCAT44(extraout_var,iVar1);
  if ((value & 0xffffffff80000000) == 0) {
    if (value <= (ulong)(long)size) {
      local_26 = io::CodedOutputStream::default_serialization_deterministic_ & 1;
      local_60._0_8_ = value + (long)data;
      local_60.filename_ = (char *)0x0;
      local_60.message_.field_2._8_8_ = 0;
      local_28 = 0;
      (*this->_vptr_MessageLite[0xe])(this,data);
      return true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1c7);
    (*this->_vptr_MessageLite[2])(&local_80,this);
    pLVar2 = internal::LogMessage::operator<<(&local_60,&local_80);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," exceeded maximum protobuf size of 2GB: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(&local_81,pLVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    internal::LogMessage::~LogMessage(&local_60);
  }
  return false;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}